

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

Result __thiscall wabt::OutputBuffer::WriteToFile(OutputBuffer *this,string_view filename)

{
  FILE *pFVar1;
  bool bVar2;
  char *__filename;
  FILE *__stream;
  undefined8 uVar3;
  uchar *__ptr;
  size_type_conflict sVar4;
  size_t sVar5;
  ssize_t bytes;
  FILE *file;
  string local_48 [8];
  string filename_str;
  OutputBuffer *this_local;
  string_view filename_local;
  
  filename_local._M_len = (size_t)filename._M_str;
  this_local = (OutputBuffer *)filename._M_len;
  filename_str.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_48,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (allocator<char> *)((long)&file + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
  __filename = (char *)std::__cxx11::string::c_str();
  __stream = fopen(__filename,"wb");
  pFVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"%s:%d: unable to open %s for writing\n",
            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc",
            0x8b,uVar3);
    Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
  }
  else {
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->data);
    if (bVar2) {
      fclose(__stream);
      Result::Result((Result *)((long)&filename_local._M_str + 4),Ok);
    }
    else {
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      sVar5 = fwrite(__ptr,1,sVar4,__stream);
      if (-1 < (long)sVar5) {
        sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
        if (sVar5 == sVar4) {
          fclose(__stream);
          Result::Result((Result *)((long)&filename_local._M_str + 4),Ok);
          goto LAB_001677c9;
        }
      }
      pFVar1 = _stderr;
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s:%d: failed to write %zd bytes to %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc",
              0x97,sVar4,uVar3);
      fclose(__stream);
      Result::Result((Result *)((long)&filename_local._M_str + 4),Error);
    }
  }
LAB_001677c9:
  std::__cxx11::string::~string(local_48);
  return (Result)filename_local._M_str._4_4_;
}

Assistant:

Result OutputBuffer::WriteToFile(std::string_view filename) const {
  std::string filename_str(filename);
  FILE* file = fopen(filename_str.c_str(), "wb");
  if (!file) {
    ERROR("unable to open %s for writing\n", filename_str.c_str());
    return Result::Error;
  }

  if (data.empty()) {
    fclose(file);
    return Result::Ok;
  }

  ssize_t bytes = fwrite(data.data(), 1, data.size(), file);
  if (bytes < 0 || static_cast<size_t>(bytes) != data.size()) {
    ERROR("failed to write %" PRIzd " bytes to %s\n", data.size(),
          filename_str.c_str());
    fclose(file);
    return Result::Error;
  }

  fclose(file);
  return Result::Ok;
}